

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

void __thiscall kiste::line_data_t::enforce_trailing_text_segment(line_data_t *this)

{
  reference pvVar1;
  allocator<char> local_41;
  value_type local_40;
  line_data_t *local_10;
  line_data_t *this_local;
  
  local_10 = this;
  enforce_at_least_one_segment(this);
  pvVar1 = std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::back(&this->_segments);
  if (pvVar1->_type != text) {
    local_40._end_pos = 0;
    local_40._type = text;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40._text,"",&local_41);
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::push_back
              (&this->_segments,&local_40);
    segment_t::~segment_t(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

auto line_data_t::enforce_trailing_text_segment() -> void
  {
    enforce_at_least_one_segment();
    if (_segments.back()._type != segment_type::text)
    {
      _segments.push_back({0, segment_type::text, ""});
    }
  }